

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O1

MatchResult __thiscall r_exec::_Fact::is_timeless_evidence(_Fact *this,_Fact *target)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  MatchResult MVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  iVar3 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(this,0);
  iVar4 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[9])(target,0);
  bVar1 = MatchObject((Code *)CONCAT44(extraout_var,iVar3),(Code *)CONCAT44(extraout_var_00,iVar4));
  iVar3 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(target,0);
  iVar4 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[5])(this,0);
  bVar2 = r_code::Atom::operator==
                    ((Atom *)CONCAT44(extraout_var_01,iVar3),(Atom *)CONCAT44(extraout_var_02,iVar4)
                    );
  if (bVar1) {
    MVar5 = (MatchResult)(bVar2 ^ 1);
  }
  else {
    if (bVar2 != 0) {
      iVar3 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                super_Code.super__Object._vptr__Object[9])(this,0);
      iVar4 = (*(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object._vptr__Object[9])(target,0);
      bVar1 = CounterEvidence((Code *)CONCAT44(extraout_var_03,iVar3),
                              (Code *)CONCAT44(extraout_var_04,iVar4));
      if (bVar1) {
        return MATCH_SUCCESS_NEGATIVE;
      }
    }
    MVar5 = MATCH_FAILURE;
  }
  return MVar5;
}

Assistant:

MatchResult _Fact::is_timeless_evidence(const _Fact *target) const
{
    if (MatchObject(get_reference(0), target->get_reference(0))) {
        MatchResult r;

        if (target->code(0) == code(0)) {
            r = MATCH_SUCCESS_POSITIVE;
        } else {
            r = MATCH_SUCCESS_NEGATIVE;
        }

        return r;
    } else if (target->code(0) == code(0)) { // check for a counter-evidence only if both the lhs and rhs are of the same kind of fact.
        if (CounterEvidence(get_reference(0), target->get_reference(0))) {
            return MATCH_SUCCESS_NEGATIVE;
        }
    }

    return MATCH_FAILURE;
}